

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

bool __thiscall
args::ArgumentParser::AddCompletionReply(ArgumentParser *this,string *cur,string *choice)

{
  bool bVar1;
  OptionType OVar2;
  ulong uVar3;
  long lVar4;
  string *in_RDX;
  ulong in_RSI;
  ArgumentParser *in_RDI;
  value_type *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  value_type *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string local_40 [32];
  string *local_20;
  ulong local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (lVar4 = std::__cxx11::string::find(local_20,local_18), lVar4 != 0)) {
    local_1 = false;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    if (((bVar1) &&
        (OVar2 = ParseOption(in_RDI,in_stack_ffffffffffffffa0,
                             SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0)), OVar2 == LongFlag))
       && (lVar4 = std::__cxx11::string::find(local_20,(ulong)&in_RDI->longseparator), lVar4 != -1))
    {
      std::__cxx11::string::find(local_20,(ulong)&in_RDI->longseparator);
      std::__cxx11::string::substr((ulong)local_40,(ulong)local_20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_20,in_stack_ffffffffffffff88);
      std::__cxx11::string::~string(local_40);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool AddCompletionReply(const std::string &cur, const std::string &choice)
            {
                if (cur.empty() || choice.find(cur) == 0)
                {
                    if (completion->syntax == "bash" && ParseOption(choice) == OptionType::LongFlag && choice.find(longseparator) != std::string::npos)
                    {
                        completion->reply.push_back(choice.substr(choice.find(longseparator) + 1));
                    } else
                    {
                        completion->reply.push_back(choice);
                    }
                    return true;
                }

                return false;
            }